

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::throw_exception<hta::Exception,char_const*,unsigned_long,char_const*>
               (char *args,unsigned_long args_1,char *args_2)

{
  Exception *this;
  string local_1e0;
  make_exception<const_char_*,_unsigned_long,_const_char_*> local_1a9;
  stringstream local_1a8 [8];
  stringstream msg;
  char *args_local_2;
  unsigned_long args_local_1;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  detail::make_exception<const_char_*,_unsigned_long,_const_char_*>::operator()
            (&local_1a9,(stringstream *)local_1a8,args,args_1,args_2);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1e0);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}